

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reply_deferrable.c
# Opt level: O0

mpt_reply_context_detached * contextDefer(mpt_reply_context *ptr)

{
  uintptr_t uVar1;
  long local_30;
  size_t post;
  replyDataDelayed *def;
  mpt_reply_context_defer *ctx;
  mpt_reply_context *ptr_local;
  
  if (*(short *)((long)&ptr[1]._vptr + 2) == 0) {
    ptr_local = (mpt_reply_context *)0x0;
  }
  else {
    uVar1 = mpt_refcount_raise((mpt_refcount *)(ptr + -2));
    if (uVar1 == 0) {
      ptr_local = (mpt_reply_context *)0x0;
    }
    else {
      if ((ulong)*(ushort *)&ptr[1]._vptr < 4) {
        local_30 = 0;
      }
      else {
        local_30 = (ulong)*(ushort *)&ptr[1]._vptr - 4;
      }
      ptr_local = (mpt_reply_context *)malloc(local_30 + 0x18);
      if (ptr_local == (mpt_reply_context *)0x0) {
        mpt_refcount_lower((mpt_refcount *)(ptr + -2));
        ptr_local = (mpt_reply_context *)0x0;
      }
      else {
        ptr_local->_vptr = (_mpt_vptr_reply_context *)&contextDefer::deferCtx;
        memcpy(ptr_local + 2,ptr + 1,local_30 + 8);
        ptr_local[1]._vptr = (_mpt_vptr_reply_context *)(ptr + -4);
        *(undefined2 *)((long)&ptr[1]._vptr + 2) = 0;
      }
    }
  }
  return (mpt_reply_context_detached *)ptr_local;
}

Assistant:

static MPT_INTERFACE(reply_context_detached) *contextDefer(MPT_STRUCT(reply_context) *ptr)
{
	static const MPT_INTERFACE_VPTR(reply_context_detached) deferCtx = {
		deferReply
	};
	MPT_STRUCT(reply_context_defer) *ctx = MPT_baseaddr(reply_context_defer, ptr, _ctx);
	struct replyDataDelayed *def;
	size_t post;
	
	if (!ctx->data.len) {
		return 0;
	}
	if (!mpt_refcount_raise(&ctx->ref)) {
		return 0;
	}
	if ((post = ctx->data._max) < sizeof(ctx->data.val)) {
		post = 0;
	} else {
		post -= sizeof(ctx->data.val);
	}
	if (!(def = malloc(sizeof(*def) + post))) {
		mpt_refcount_lower(&ctx->ref);
		return 0;
	}
	def->_rc._vptr = &deferCtx;
	memcpy(&def->data, &ctx->data, sizeof(def->data) + post);
	def->base = ctx;
	
	/* reply data belongs to new context */
	ctx->data.len = 0;
	
	return &def->_rc;
}